

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Type.cpp
# Opt level: O3

bool __thiscall slang::ast::Type::isDerivedFrom(Type *this,Type *base)

{
  bool bVar1;
  Type *this_00;
  Type *this_01;
  
  this_00 = this->canonical;
  if (this_00 == (Type *)0x0) {
    this->canonical = this;
    this_00 = this;
    do {
      this_00 = DeclaredType::getType((DeclaredType *)(this_00 + 1));
      this->canonical = this_00;
    } while ((this_00->super_Symbol).kind == TypeAlias);
  }
  this_01 = base->canonical;
  if (this_01 == (Type *)0x0) {
    base->canonical = base;
    this_01 = base;
    do {
      this_01 = DeclaredType::getType((DeclaredType *)(this_01 + 1));
      base->canonical = this_01;
    } while ((this_01->super_Symbol).kind == TypeAlias);
  }
  bVar1 = isClass(this_01);
  if (bVar1) {
    do {
      if (this_00 == (Type *)0x0) goto LAB_0039535b;
      bVar1 = isClass(this_00);
      if (!bVar1) {
        bVar1 = isError(this_00);
        if (bVar1) {
          return true;
        }
        goto LAB_0039535b;
      }
      if (*(int *)&this_00[1].super_Symbol.nextInScope != 0) {
        Scope::elaborate((Scope *)(this_00 + 1));
      }
      this_00 = (Type *)this_00[2].super_Symbol.name._M_len;
    } while (this_00 != this_01);
    bVar1 = true;
  }
  else {
LAB_0039535b:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Type::isDerivedFrom(const Type& base) const {
    const Type* d = &getCanonicalType();
    const Type* b = &base.getCanonicalType();
    if (!b->isClass())
        return false;

    while (d && d->isClass()) {
        d = d->as<ClassType>().getBaseClass();
        if (d == b)
            return true;
    }

    // Allow error types to be convertible / derivable from anything else,
    // to prevent knock-on errors from being reported.
    if (d && d->isError())
        return true;

    return false;
}